

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_import.c
# Opt level: O0

REF_STATUS
ref_import_meshb_jump
          (FILE *file,REF_INT version,REF_FILEPOS *key_pos,REF_INT keyword,REF_BOOL *available,
          REF_FILEPOS *next_position)

{
  long __off;
  int iVar1;
  size_t sVar2;
  REF_STATUS ref_private_macro_code_rss;
  REF_LONG ref_private_status_reis_bi_2;
  REF_LONG ref_private_status_reis_ai_2;
  REF_LONG ref_private_status_reis_bi_1;
  REF_LONG ref_private_status_reis_ai_1;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_FILEPOS position;
  REF_FILEPOS *pRStack_40;
  REF_INT keyword_code;
  REF_FILEPOS *next_position_local;
  REF_BOOL *available_local;
  REF_FILEPOS *pRStack_28;
  REF_INT keyword_local;
  REF_FILEPOS *key_pos_local;
  FILE *pFStack_18;
  REF_INT version_local;
  FILE *file_local;
  
  if ((keyword < 0) && (0x9b < keyword)) {
    *available = 0;
    *next_position = 0;
    file_local._4_4_ = 3;
  }
  else {
    __off = key_pos[keyword];
    if (__off == -1) {
      *available = 0;
      *next_position = 0;
      file_local._4_4_ = 0;
    }
    else {
      *available = 1;
      pRStack_40 = next_position;
      next_position_local = (REF_FILEPOS *)available;
      available_local._4_4_ = keyword;
      pRStack_28 = key_pos;
      key_pos_local._4_4_ = version;
      pFStack_18 = (FILE *)file;
      iVar1 = fseeko((FILE *)file,__off,0);
      if ((long)iVar1 == 0) {
        sVar2 = fread((void *)((long)&position + 4),4,1,pFStack_18);
        if (sVar2 == 1) {
          if ((long)available_local._4_4_ == (long)position._4_4_) {
            file_local._4_4_ = meshb_pos((FILE *)pFStack_18,key_pos_local._4_4_,pRStack_40);
            if (file_local._4_4_ == 0) {
              file_local._4_4_ = 0;
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                     ,0x5cb,"ref_import_meshb_jump",(ulong)file_local._4_4_,"pos");
            }
          }
          else {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                   ,0x5ca,"ref_import_meshb_jump","keyword code",(long)available_local._4_4_,
                   (long)position._4_4_);
            file_local._4_4_ = 1;
          }
        }
        else {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
                 0x5c9,"ref_import_meshb_jump","keyword code",1,sVar2);
          file_local._4_4_ = 1;
        }
      }
      else {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
               0x5c8,"ref_import_meshb_jump","fseeko keyword failed",0,(long)iVar1);
        file_local._4_4_ = 1;
      }
    }
  }
  return file_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_import_meshb_jump(FILE *file, REF_INT version,
                                         REF_FILEPOS *key_pos, REF_INT keyword,
                                         REF_BOOL *available,
                                         REF_FILEPOS *next_position) {
  REF_INT keyword_code;
  REF_FILEPOS position;

  if (keyword < 0 && REF_IMPORT_MESHB_LAST_KEYWORD <= keyword) {
    *available = REF_FALSE;
    *next_position = 0;
    return REF_INVALID;
  }
  position = key_pos[keyword];

  if ((REF_FILEPOS)REF_EMPTY != position) {
    *available = REF_TRUE;
  } else {
    *available = REF_FALSE;
    *next_position = 0;
    return REF_SUCCESS;
  }
  REIS(0, fseeko(file, position, SEEK_SET), "fseeko keyword failed");
  REIS(1, fread((unsigned char *)&keyword_code, 4, 1, file), "keyword code");
  REIS(keyword, keyword_code, "keyword code");
  RSS(meshb_pos(file, version, next_position), "pos");
  return REF_SUCCESS;
}